

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O2

void show_keymap_menu(nh_bool readonly)

{
  wchar_t wVar1;
  nh_bool nVar2;
  int __fd;
  nh_menuitem_conflict *items;
  size_t sVar3;
  wchar_t id;
  wchar_t wVar4;
  char *pcVar5;
  nh_cmd_desc *pnVar6;
  long lVar7;
  long lVar8;
  nh_menuitem_conflict *item;
  nh_menuitem *_item_;
  ulong uVar9;
  fnchar filename [256];
  char local_138 [264];
  
  wVar1 = cmdcount;
  if (cmdcount == L'\0') {
    load_keymap();
  }
  items = (nh_menuitem_conflict *)malloc((long)cmdcount * 0x10c + 0x27c8);
  do {
    items->id = L'\0';
    items->role = MI_HEADING;
    items->accel = '\0';
    items->group_accel = '\0';
    items->selected = '\0';
    builtin_strncpy(items->caption,"Command\tDescription\tKey",0x18);
    pnVar6 = builtin_commands;
    wVar4 = L'\xffffffff';
    for (lVar8 = 0x10c; lVar8 != 0x24a4; lVar8 = lVar8 + 0x10c) {
      id = L'\0';
      if (readonly == '\0') {
        id = wVar4;
      }
      add_keylist_command(pnVar6,(nh_menuitem *)(items->caption + lVar8 + -8),id);
      wVar4 = wVar4 + L'\xffffffff';
      pnVar6 = pnVar6 + 1;
    }
    lVar8 = 0;
    lVar7 = 0;
    item = items + 0x23;
    while (lVar7 < cmdcount) {
      lVar7 = lVar7 + 1;
      wVar4 = L'\0';
      if (readonly == '\0') {
        wVar4 = (wchar_t)lVar7;
      }
      add_keylist_command((nh_cmd_desc *)(commandlist->name + lVar8),(nh_menuitem *)item,wVar4);
      lVar8 = lVar8 + 0x6c;
      item = item + 1;
    }
    if (readonly == '\0') {
      item->accel = '\0';
      item->group_accel = '\0';
      item->selected = '\0';
      item->id = L'\0';
      item->role = MI_TEXT;
      wVar4 = (int)lVar7 + L'%';
      item->caption[0] = '\0';
      item[1].id = L'\xffffd8f0';
      item[1].role = MI_NORMAL;
      item[1].accel = '!';
      item[1].group_accel = '\0';
      item[1].selected = '\0';
      item[1].caption[0] = '!';
      item[1].caption[1] = '!';
      item[1].caption[2] = '!';
      item[1].caption[3] = '\t';
      item[1].caption[4] = 'R';
      item[1].caption[5] = 'e';
      item[1].caption[6] = 's';
      item[1].caption[7] = 'e';
      item[1].caption[8] = 't';
      item[1].caption[9] = ' ';
      item[1].caption[10] = 'a';
      item[1].caption[0xb] = 'l';
      item[1].caption[0xc] = 'l';
      item[1].caption[0xd] = ' ';
      item[1].caption[0xe] = 'k';
      item[1].caption[0xf] = 'e';
      item[1].caption[0x10] = 'y';
      item[1].caption[0x11] = ' ';
      item[1].caption[0x12] = 'b';
      item[1].caption[0x13] = 'i';
      item[1].caption[0x14] = 'n';
      item[1].caption[0x15] = 'd';
      item[1].caption[0x16] = 'i';
      item[1].caption[0x17] = 'n';
      item[1].caption[0x18] = 'g';
      item[1].caption[0x19] = 's';
      item[1].caption[0x1a] = ' ';
      item[1].caption[0x1b] = 't';
      item[1].caption[0x1c] = 'o';
      item[1].caption[0x1d] = ' ';
      item[1].caption[0x1e] = 'b';
      item[1].caption[0x1f] = 'u';
      item[1].caption[0x20] = 'i';
      item[1].caption[0x21] = 'l';
      item[1].caption[0x22] = 't';
      item[1].caption[0x23] = '-';
      item[1].caption[0x24] = 'i';
      item[1].caption[0x25] = 'n';
      item[1].caption[0x26] = ' ';
      item[1].caption[0x27] = 'd';
      item[1].caption[0x28] = 'e';
      item[1].caption[0x29] = 'f';
      item[1].caption[0x2a] = 'a';
      item[1].caption[0x2b] = 'u';
      item[1].caption[0x2c] = 'l';
      item[1].caption[0x2d] = 't';
      item[1].caption[0x2e] = 's';
      item[1].caption[0x2f] = '\t';
      item[1].caption[0x30] = '!';
      item[1].caption[0x31] = '!';
      item[1].caption[0x32] = '!';
      item[1].caption[0x33] = '\0';
    }
    else {
      wVar4 = (int)lVar7 + L'#';
    }
    wVar4 = curses_display_menu_core
                      (items,wVar4,"Keymap",(uint)(readonly == '\0'),(wchar_t *)0x0,L'\0',L'\0',
                       _COLS,_LINES,set_command_keys,'\0');
  } while (L'\0' < wVar4);
  free(items);
  filename[0] = '\0';
  nVar2 = get_gamedir(CONFIG_DIR,filename);
  if (nVar2 != '\0') {
    sVar3 = strlen(filename);
    builtin_memcpy(filename + sVar3,"keymap.conf",0xc);
    __fd = open(filename,0x242,0x1a4);
    if (__fd != -1) {
      fchmod(__fd,0x1a4);
      for (uVar9 = 1; uVar9 != 0x1ff; uVar9 = uVar9 + 1) {
        pnVar6 = keymap[uVar9];
        if ((pnVar6 == (nh_cmd_desc *)0x0) &&
           (pnVar6 = unknown_keymap[uVar9], pnVar6 == (nh_cmd_desc *)0x0)) {
          pnVar6 = (nh_cmd_desc *)0x11961d;
        }
        sprintf(local_138,"%x %s\n",uVar9 & 0xffffffff,pnVar6);
        sVar3 = strlen(local_138);
        write(__fd,local_138,sVar3);
      }
      lVar7 = 0;
      for (lVar8 = 0; lVar8 < cmdcount; lVar8 = lVar8 + 1) {
        pcVar5 = "NOEXT %s\n";
        if ((*(uint *)(commandlist->desc + lVar7 + 0x54) >> 10 & 1) != 0) {
          pcVar5 = "EXT %s\n";
        }
        sprintf(local_138,pcVar5,commandlist->name + lVar7);
        sVar3 = strlen(local_138);
        write(__fd,local_138,sVar3);
        lVar7 = lVar7 + 0x6c;
      }
      lVar7 = 0;
      for (lVar8 = 0; lVar8 < unknown_count; lVar8 = lVar8 + 1) {
        pcVar5 = "NOEXT %s\n";
        if ((*(uint *)(unknown_commands->desc + lVar7 + 0x54) >> 10 & 1) != 0) {
          pcVar5 = "EXT %s\n";
        }
        sprintf(local_138,pcVar5,unknown_commands->name + lVar7);
        sVar3 = strlen(local_138);
        write(__fd,local_138,sVar3);
        lVar7 = lVar7 + 0x6c;
      }
      close(__fd);
    }
  }
  if (wVar1 == L'\0') {
    free_keymap();
  }
  return;
}

Assistant:

void show_keymap_menu(nh_bool readonly)
{
    int i, n, icount;
    nh_bool need_init = !cmdcount;
    struct nh_menuitem *items;

    if (need_init)
	load_keymap();

    items = malloc(sizeof(struct nh_menuitem) *
                                 (ARRAY_SIZE(builtin_commands) + cmdcount + 4));
    
    do {
	set_menuitem(&items[0], 0, MI_HEADING, "Command\tDescription\tKey", 0, FALSE);
	icount = 1;
	/* add builtin commands */
	for (i = 0; i < ARRAY_SIZE(builtin_commands); i++) {
	    add_keylist_command(&builtin_commands[i], &items[icount],
				readonly ? 0 : -(i+1));
	    icount++;
	}
	
	/* add in-game commands */
	for (i = 0; i < cmdcount; i++) {
	    add_keylist_command(&commandlist[i], &items[icount],
				readonly ? 0 : (i+1));
	    icount++;
	}
	
	if (!readonly) {
	    set_menuitem(&items[icount++], 0, MI_TEXT, "", 0, FALSE);
	    set_menuitem(&items[icount++], RESET_BINDINGS_ID, MI_NORMAL,
			"!!!\tReset all key bindings to built-in defaults\t!!!", '!', FALSE);
	}
	n = curses_display_menu_core(items, icount, "Keymap", readonly ? PICK_NONE :
				     PICK_ONE, NULL, 0, 0, COLS, LINES,
				     set_command_keys, FALSE);
    } while(n > 0);
    free(items);
    
    write_keymap();

    if (need_init)
	free_keymap();
}